

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optCompare_valueOptNotEmptyEqual_Test::optCompare_valueOptNotEmptyEqual_Test
          (optCompare_valueOptNotEmptyEqual_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c75a8;
  return;
}

Assistant:

TEST(optCompare, valueOptNotEmptyEqual)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_TRUE(1 == i);
  EXPECT_FALSE(1 != i);
  EXPECT_FALSE(1 < i);
  EXPECT_FALSE(1 > i);
  EXPECT_TRUE(1 <= i);
  EXPECT_TRUE(1 >= i);
}